

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivCountClasses(Gia_Man_t *p)

{
  int iVar1;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    local_1c = 1;
    while( true ) {
      iVar1 = Gia_ManObjNum(p);
      if (iVar1 <= local_1c) break;
      iVar1 = Gia_ObjIsHead(p,local_1c);
      local_20 = iVar1 + local_20;
      local_1c = local_1c + 1;
    }
    p_local._4_4_ = local_20;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManEquivCountClasses( Gia_Man_t * p )
{
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
        Counter += Gia_ObjIsHead(p, i);
    return Counter;
}